

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.cpp
# Opt level: O0

Str32 tl::toUtf32(CStr o)

{
  char32_t *pcVar1;
  undefined8 in_RDX;
  char *extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar2;
  undefined8 extraout_RDX_02;
  StrT<char32_t> *this;
  CStr o_00;
  Str32 SVar3;
  uint local_60;
  char32_t local_5c;
  u32 i;
  char32_t token;
  char *c;
  undefined8 local_38;
  CStr local_30;
  u32 size;
  undefined4 uStack_1c;
  CStr o_local;
  Str32 *res;
  
  this = o._0_8_;
  size = (u32)o._str;
  local_30._str._7_1_ = 0;
  o_local._0_8_ = in_RDX;
  o_local._str = (char *)this;
  StrT<char32_t>::StrT(this);
  local_38 = CONCAT44(uStack_1c,size);
  local_30._size = o_local._size;
  local_30._4_4_ = o_local._4_4_;
  o_00._str = extraout_RDX;
  o_00._size = o_local._size;
  o_00._4_4_ = o_local._4_4_;
  local_30._str._0_4_ = calcSizeUtf32((tl *)(ulong)size,o_00);
  uVar2 = extraout_RDX_00;
  if (((u32)local_30._str != 0) && ((u32)local_30._str != 0xffffffff)) {
    StrT<char32_t>::resizeNoCopy(this,(u32)local_30._str);
    _i = CStrT<char>::c_str((CStrT<char> *)&size);
    local_5c = getUtf32TokenAndAdvance((char **)&i);
    uVar2 = extraout_RDX_01;
    for (local_60 = 0; local_60 < (u32)local_30._str && local_5c != L'\xffffffff';
        local_60 = local_60 + 1) {
      pcVar1 = StrT<char32_t>::operator[](this,local_60);
      *pcVar1 = local_5c;
      local_5c = getUtf32TokenAndAdvance((char **)&i);
      uVar2 = extraout_RDX_02;
    }
  }
  SVar3._8_8_ = uVar2;
  SVar3._str = (char32_t *)this;
  return SVar3;
}

Assistant:

Str32 toUtf32(CStr o)
{
    Str32 res;
    const u32 size = calcSizeUtf32(o);
    if(size == 0 || size == TOKEN_ERROR)
        return res;
    res.resizeNoCopy(size);
    const char* c = o.c_str();
    char32_t token = getUtf32TokenAndAdvance(c);
    for(u32 i = 0; i < size && token != TOKEN_ERROR; i++) {
        res[i] = token;
        token = getUtf32TokenAndAdvance(c);
    }
    return res;
}